

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::_q_currentTabChanged(QMdiAreaPrivate *this,int index)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  int in_ESI;
  QMdiAreaPrivate *in_RDI;
  QMdiSubWindow *subWindow;
  QMdiSubWindow *lastActive;
  long in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  QTabBar *in_stack_ffffffffffffffe0;
  QMdiSubWindow *in_stack_ffffffffffffffe8;
  
  if ((in_RDI->tabBar != (QMdiAreaTabBar *)0x0) && (-1 < in_ESI)) {
    if (-1 < in_RDI->indexToLastActiveTab) {
      in_stack_ffffffffffffffd4 = in_RDI->indexToLastActiveTab;
      iVar2 = QTabBar::count((QTabBar *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if (in_stack_ffffffffffffffd4 < iVar2) {
        in_stack_ffffffffffffffc8 = (long)in_RDI->indexToLastActiveTab;
        qVar3 = QList<QPointer<QMdiSubWindow>_>::size(&in_RDI->childWindows);
        if (in_stack_ffffffffffffffc8 < qVar3) {
          QList<QPointer<QMdiSubWindow>_>::at
                    ((QList<QPointer<QMdiSubWindow>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
          in_stack_ffffffffffffffe8 =
               ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x60ed77);
          if ((in_stack_ffffffffffffffe8 != (QMdiSubWindow *)0x0) &&
             (bVar1 = QWidget::isHidden((QWidget *)0x60ed8e), bVar1)) {
            QTabBar::setTabEnabled
                      (in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20),
                       SUB81((ulong)in_RDI >> 0x18,0));
          }
        }
      }
    }
    in_RDI->indexToLastActiveTab = in_ESI;
    QList<QPointer<QMdiSubWindow>_>::at
              ((QList<QPointer<QMdiSubWindow>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x60edd7);
    activateWindow(in_RDI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void QMdiAreaPrivate::_q_currentTabChanged(int index)
{
#if !QT_CONFIG(tabbar)
    Q_UNUSED(index);
#else
    if (!tabBar || index < 0)
        return;

    // If the previous active sub-window was hidden, disable the tab.
    if (indexToLastActiveTab >= 0 && indexToLastActiveTab < tabBar->count()
        && indexToLastActiveTab < childWindows.size()) {
        QMdiSubWindow *lastActive = childWindows.at(indexToLastActiveTab);
        if (lastActive && lastActive->isHidden())
            tabBar->setTabEnabled(indexToLastActiveTab, false);
    }

    indexToLastActiveTab = index;
    Q_ASSERT(childWindows.size() > index);
    QMdiSubWindow *subWindow = childWindows.at(index);
    Q_ASSERT(subWindow);
    activateWindow(subWindow);
#endif // QT_CONFIG(tabbar)
}